

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cc
# Opt level: O0

void __thiscall
re2c::MatchOp::split
          (MatchOp *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *cs)

{
  Range *pRVar1;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar2;
  uint32_t local_3c;
  _Base_ptr local_38;
  undefined1 local_30;
  uint32_t local_24;
  Range *local_20;
  Range *r;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *cs_local;
  MatchOp *this_local;
  
  r = (Range *)cs;
  cs_local = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)this;
  for (local_20 = this->match; pRVar1 = r, local_20 != (Range *)0x0;
      local_20 = Range::next(local_20)) {
    local_24 = Range::lower(local_20);
    pVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       pRVar1,&local_24);
    pRVar1 = r;
    local_38 = (_Base_ptr)pVar2.first._M_node;
    local_30 = pVar2.second;
    local_3c = Range::upper(local_20);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)pRVar1,
               &local_3c);
  }
  return;
}

Assistant:

void MatchOp::split (std::set<uint32_t> & cs)
{
	for (Range *r = match; r; r = r->next ())
	{
		cs.insert (r->lower ());
		cs.insert (r->upper ());
	}
}